

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_1::PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)0>::
initializeTexCoords(PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)0> *this,
                   IVec2 *textureSize,TexCoordParams *texCoordParams,bool useSafeTexCoords)

{
  int iVar1;
  Vector<float,_2> local_54;
  int local_4c;
  int i;
  Vector<float,_2> local_40;
  Vec2 local_38;
  Vec2 rawCoord;
  int x;
  int y;
  float gridSizeFloat;
  bool useSafeTexCoords_local;
  TexCoordParams *texCoordParams_local;
  IVec2 *textureSize_local;
  PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)0> *this_local;
  
  iVar1 = this->m_gridSize;
  for (rawCoord.m_data[1] = 0.0; (int)rawCoord.m_data[1] < this->m_gridSize;
      rawCoord.m_data[1] = (float)((int)rawCoord.m_data[1] + 1)) {
    for (rawCoord.m_data[0] = 0.0; (int)rawCoord.m_data[0] < this->m_gridSize;
        rawCoord.m_data[0] = (float)((int)rawCoord.m_data[0] + 1)) {
      tcu::Vector<float,_2>::Vector
                ((Vector<float,_2> *)&stack0xffffffffffffffb8,
                 (float)(int)rawCoord.m_data[0] / (float)iVar1,
                 (float)(int)rawCoord.m_data[1] / (float)iVar1);
      tcu::operator*((tcu *)&local_40,(Vector<float,_2> *)&stack0xffffffffffffffb8,
                     &texCoordParams->scale);
      tcu::operator+((tcu *)&local_38,&local_40,&texCoordParams->bias);
      for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
        if (useSafeTexCoords) {
          safe2DTexCoords((Functional *)&local_54,&local_38,textureSize);
        }
        else {
          tcu::Vector<float,_2>::Vector(&local_54,&local_38);
        }
        std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                  (&this->m_texCoords,&local_54);
      }
    }
  }
  return;
}

Assistant:

void PosTexCoordQuadGrid<TEXTURETYPE_2D>::initializeTexCoords (const IVec2& textureSize, const TexCoordParams& texCoordParams, bool useSafeTexCoords)
{
	DE_ASSERT(m_texCoords.empty());

	const float gridSizeFloat = (float)m_gridSize;

	for (int y = 0; y < m_gridSize; y++)
	for (int x = 0; x < m_gridSize; x++)
	{
		Vec2 rawCoord = Vec2((float)x / gridSizeFloat, (float)y / gridSizeFloat) * texCoordParams.scale + texCoordParams.bias;

		for (int i = 0; i < 4; i++)
			m_texCoords.push_back(useSafeTexCoords ? safe2DTexCoords(rawCoord, textureSize) : rawCoord);
	}
}